

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvamemtiming.c
# Opt level: O3

int read_timings(nvamemtiming_conf *conf)

{
  byte bVar1;
  ushort uVar2;
  uint8_t *puVar3;
  
  printf("timing table at: %x\n",(ulong)(conf->vbios).timing_table_offset);
  puVar3 = (conf->vbios).data;
  uVar2 = (conf->vbios).timing_table_offset;
  if (puVar3[uVar2] == '\x10') {
    bVar1 = (conf->timing).entry;
    if (bVar1 < puVar3[(ulong)uVar2 + 2]) {
      (conf->vbios).timing_entry_length = (ushort)puVar3[(ulong)uVar2 + 3];
      (conf->vbios).timing_entry_offset =
           (ushort)puVar3[(ulong)uVar2 + 3] * (ushort)bVar1 + puVar3[(ulong)uVar2 + 1] + uVar2;
      if (conf->mode != MODE_DEEP) {
        return 0;
      }
      (conf->field_4).deep.timing_entry_offset =
           (ushort)puVar3[(ulong)uVar2 + 3] * (ushort)(conf->field_4).manual.index +
           puVar3[(ulong)uVar2 + 1] + uVar2;
      return 0;
    }
    fprintf(_stderr,"timing entry %i is higher than count(%i)\n");
  }
  else {
    fprintf(_stderr,"unknow table version %x\n");
  }
  return -1;
}

Assistant:

int read_timings(struct nvamemtiming_conf *conf)
{
	uint8_t *header;

	printf("timing table at: %x\n", conf->vbios.timing_table_offset);
	header = &conf->vbios.data[conf->vbios.timing_table_offset];
	if (header[0] != 0x10) {
		fprintf(stderr, "unknow table version %x\n", header[0]);
		return -1;
	}

	if (conf->timing.entry >= header[2]) {
		fprintf(stderr, "timing entry %i is higher than count(%i)\n", conf->timing.entry, header[2]);
		return -1;
	}

	conf->vbios.timing_entry_length = header[3];
	conf->vbios.timing_entry_offset = conf->vbios.timing_table_offset + header[1] + conf->timing.entry * header[3];

	if (conf->mode == MODE_DEEP)
		conf->deep.timing_entry_offset = conf->vbios.timing_table_offset + header[1] + conf->deep.entry * header[3];

	return 0;
}